

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_mkdtemp(void)

{
  int iVar1;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char *path_template;
  int r;
  
  loop = uv_default_loop();
  iVar1 = uv_fs_mkdtemp(loop,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x55e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if ((long)mkdtemp_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x561,"1","==","mkdtemp_cb_count",1,"==",(long)mkdtemp_cb_count);
    abort();
  }
  iVar1 = uv_fs_mkdtemp((uv_loop_t *)0x0,&mkdtemp_req2,"test_dir_XXXXXX",(uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x565,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  check_mkdtemp_result(&mkdtemp_req2);
  iVar1 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x569,"0","!=","strcmp(mkdtemp_req1.path, mkdtemp_req2.path)",0,"!=",0);
    abort();
  }
  rmdir(mkdtemp_req1.path);
  rmdir(mkdtemp_req2.path);
  uv_fs_req_cleanup(&mkdtemp_req1);
  uv_fs_req_cleanup(&mkdtemp_req2);
  close_loop(loop);
  iVar1 = uv_loop_close(loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0x571,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_mkdtemp) {
  int r;
  const char* path_template = "test_dir_XXXXXX";

  loop = uv_default_loop();

  r = uv_fs_mkdtemp(loop, &mkdtemp_req1, path_template, mkdtemp_cb);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, mkdtemp_cb_count);

  /* sync mkdtemp */
  r = uv_fs_mkdtemp(NULL, &mkdtemp_req2, path_template, NULL);
  ASSERT_OK(r);
  check_mkdtemp_result(&mkdtemp_req2);

  /* mkdtemp return different values on subsequent calls */
  ASSERT_NE(0, strcmp(mkdtemp_req1.path, mkdtemp_req2.path));

  /* Cleanup */
  rmdir(mkdtemp_req1.path);
  rmdir(mkdtemp_req2.path);
  uv_fs_req_cleanup(&mkdtemp_req1);
  uv_fs_req_cleanup(&mkdtemp_req2);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}